

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFileDB.cpp
# Opt level: O3

string * __thiscall
ObjectFileRecord::to_unique_name_abi_cxx11_(string *__return_storage_ptr__,ObjectFileRecord *this)

{
  size_type *psVar1;
  uint uVar2;
  pointer pcVar3;
  uint __val;
  undefined8 uVar4;
  uint uVar5;
  undefined8 *puVar6;
  uint uVar7;
  ulong uVar8;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  pcVar3 = (this->name)._M_dataplus._M_p;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (this->name)._M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  uVar2 = this->version;
  __val = -uVar2;
  if (0 < (int)uVar2) {
    __val = uVar2;
  }
  __len = 1;
  if (9 < __val) {
    uVar8 = (ulong)__val;
    uVar5 = 4;
    do {
      __len = uVar5;
      uVar7 = (uint)uVar8;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_0011eb29;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_0011eb29;
      }
      if (uVar7 < 10000) goto LAB_0011eb29;
      uVar8 = uVar8 / 10000;
      uVar5 = __len + 4;
    } while (99999 < uVar7);
    __len = __len + 1;
  }
LAB_0011eb29:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_50),__len,__val);
  uVar8 = 0xf;
  if (local_70 != local_60) {
    uVar8 = local_60[0];
  }
  if (uVar8 < (ulong)(local_48 + local_68)) {
    uVar8 = 0xf;
    if (local_50 != local_40) {
      uVar8 = local_40[0];
    }
    if ((ulong)(local_48 + local_68) <= uVar8) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_70);
      goto LAB_0011ebb5;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50);
LAB_0011ebb5:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar1) {
    uVar4 = puVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ObjectFileRecord::to_unique_name() const {
  return name + "-v" + std::to_string(version);
}